

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O1

uint32 dumbfile_cgetul(DUMBFILE *f)

{
  uint uVar1;
  long lVar2;
  uint32 rv;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  do {
    if (f->pos < 0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (*f->dfs->getc)(f->file);
      if ((int)uVar1 < 0) {
        lVar2 = -1;
      }
      else {
        lVar2 = f->pos + 1;
      }
      f->pos = lVar2;
    }
    uVar4 = uVar1;
  } while ((-1 < (int)uVar1) &&
          (uVar3 = uVar3 << 7 | uVar1 & 0x7f, uVar4 = uVar3, (char)uVar1 < '\0'));
  return uVar4;
}

Assistant:

uint32 DUMBEXPORT dumbfile_cgetul(DUMBFILE *f)
{
	uint32 rv = 0;
	int v;

	do {
		v = dumbfile_getc(f);

		if (v < 0)
			return v;

		rv <<= 7;
		rv |= v & 0x7F;
	} while (v & 0x80);

	return rv;
}